

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3FixSrcList(DbFixer *pFix,SrcList *pList)

{
  char *zRight;
  char *zLeft;
  ExprList *pEVar1;
  int iVar2;
  int iVar3;
  SrcList_item *pSVar4;
  ExprList_item *pEVar5;
  int iVar6;
  
  if ((pList != (SrcList *)0x0) && (0 < pList->nSrc)) {
    zRight = pFix->zDb;
    pSVar4 = pList->a;
    iVar6 = 0;
    do {
      if (pFix->bVarOnly == 0) {
        zLeft = pSVar4->zDatabase;
        if (zLeft != (char *)0x0) {
          iVar2 = sqlite3StrICmp(zLeft,zRight);
          if (iVar2 != 0) {
            sqlite3ErrorMsg(pFix->pParse,"%s %T cannot reference objects in database %s",pFix->zType
                            ,pFix->pName,zLeft);
            return 1;
          }
          sqlite3DbFreeNN(pFix->pParse->db,zLeft);
        }
        pSVar4->zDatabase = (char *)0x0;
        pSVar4->pSchema = pFix->pSchema;
      }
      iVar2 = sqlite3FixSelect(pFix,pSVar4->pSelect);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = sqlite3FixExpr(pFix,pSVar4->pOn);
      if (iVar2 != 0) {
        return 1;
      }
      if (((((pSVar4->fg).field_0x1 & 4) != 0) &&
          (pEVar1 = (pSVar4->u1).pFuncArg, pEVar1 != (ExprList *)0x0)) && (0 < pEVar1->nExpr)) {
        pEVar5 = pEVar1->a;
        iVar2 = 0;
        do {
          iVar3 = sqlite3FixExpr(pFix,pEVar5->pExpr);
          if (iVar3 != 0) {
            return 1;
          }
          iVar2 = iVar2 + 1;
          pEVar5 = pEVar5 + 1;
        } while (iVar2 < pEVar1->nExpr);
      }
      iVar6 = iVar6 + 1;
      pSVar4 = pSVar4 + 1;
    } while (iVar6 < pList->nSrc);
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixSrcList(
  DbFixer *pFix,       /* Context of the fixation */
  SrcList *pList       /* The Source list to check and modify */
){
  int i;
  const char *zDb;
  struct SrcList_item *pItem;

  if( NEVER(pList==0) ) return 0;
  zDb = pFix->zDb;
  for(i=0, pItem=pList->a; i<pList->nSrc; i++, pItem++){
    if( pFix->bVarOnly==0 ){
      if( pItem->zDatabase && sqlite3StrICmp(pItem->zDatabase, zDb) ){
        sqlite3ErrorMsg(pFix->pParse,
            "%s %T cannot reference objects in database %s",
            pFix->zType, pFix->pName, pItem->zDatabase);
        return 1;
      }
      sqlite3DbFree(pFix->pParse->db, pItem->zDatabase);
      pItem->zDatabase = 0;
      pItem->pSchema = pFix->pSchema;
    }
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_TRIGGER)
    if( sqlite3FixSelect(pFix, pItem->pSelect) ) return 1;
    if( sqlite3FixExpr(pFix, pItem->pOn) ) return 1;
#endif
    if( pItem->fg.isTabFunc && sqlite3FixExprList(pFix, pItem->u1.pFuncArg) ){
      return 1;
    }
  }
  return 0;
}